

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int modifyPagePointer(MemPage *pPage,Pgno iFrom,Pgno iTo,u8 eType)

{
  ushort uVar1;
  u32 uVar2;
  int iVar3;
  int local_54;
  undefined1 local_50 [8];
  CellInfo info;
  u8 *pCell;
  int rc;
  int nCell;
  int i;
  u8 eType_local;
  Pgno iTo_local;
  Pgno iFrom_local;
  MemPage *pPage_local;
  
  if (eType == '\x04') {
    uVar2 = sqlite3Get4byte(pPage->aData);
    if (uVar2 != iFrom) {
      iVar3 = sqlite3CorruptError(0x113af);
      return iVar3;
    }
    sqlite3Put4byte(pPage->aData,iTo);
  }
  else {
    if (pPage->isInit == '\0') {
      local_54 = btreeInitPage(pPage);
    }
    else {
      local_54 = 0;
    }
    if (local_54 != 0) {
      return local_54;
    }
    uVar1 = pPage->nCell;
    for (rc = 0; rc < (int)(uint)uVar1; rc = rc + 1) {
      info._16_8_ = pPage->aData +
                    (int)(uint)(pPage->maskPage &
                               CONCAT11(pPage->aCellIdx[rc << 1],
                                        pPage->aCellIdx[(long)(rc << 1) + 1]));
      if (eType == '\x03') {
        (*pPage->xParseCell)(pPage,(u8 *)info._16_8_,(CellInfo *)local_50);
        if (info.pPayload._4_2_ < (uint)info.pPayload) {
          if (pPage->aData + pPage->pBt->usableSize <
              (u8 *)(info._16_8_ + (long)(int)(uint)info.pPayload._6_2_)) {
            iVar3 = sqlite3CorruptError(0x113c2);
            return iVar3;
          }
          uVar2 = sqlite3Get4byte((u8 *)(info._16_8_ + (long)(int)(uint)info.pPayload._6_2_ + -4));
          if (iFrom == uVar2) {
            sqlite3Put4byte((uchar *)(info._16_8_ + (long)(int)(uint)info.pPayload._6_2_ + -4),iTo);
            break;
          }
        }
      }
      else {
        uVar2 = sqlite3Get4byte((u8 *)info._16_8_);
        if (uVar2 == iFrom) {
          sqlite3Put4byte((uchar *)info._16_8_,iTo);
          break;
        }
      }
    }
    if (rc == (uint)uVar1) {
      if ((eType != '\x05') ||
         (uVar2 = sqlite3Get4byte(pPage->aData + (int)(pPage->hdrOffset + 8)), uVar2 != iFrom)) {
        iVar3 = sqlite3CorruptError(0x113d4);
        return iVar3;
      }
      sqlite3Put4byte(pPage->aData + (int)(pPage->hdrOffset + 8),iTo);
    }
  }
  return 0;
}

Assistant:

static int modifyPagePointer(MemPage *pPage, Pgno iFrom, Pgno iTo, u8 eType){
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( eType==PTRMAP_OVERFLOW2 ){
    /* The pointer is always the first 4 bytes of the page in this case.  */
    if( get4byte(pPage->aData)!=iFrom ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    put4byte(pPage->aData, iTo);
  }else{
    int i;
    int nCell;
    int rc;

    rc = pPage->isInit ? SQLITE_OK : btreeInitPage(pPage);
    if( rc ) return rc;
    nCell = pPage->nCell;

    for(i=0; i<nCell; i++){
      u8 *pCell = findCell(pPage, i);
      if( eType==PTRMAP_OVERFLOW1 ){
        CellInfo info;
        pPage->xParseCell(pPage, pCell, &info);
        if( info.nLocal<info.nPayload ){
          if( pCell+info.nSize > pPage->aData+pPage->pBt->usableSize ){
            return SQLITE_CORRUPT_PAGE(pPage);
          }
          if( iFrom==get4byte(pCell+info.nSize-4) ){
            put4byte(pCell+info.nSize-4, iTo);
            break;
          }
        }
      }else{
        if( get4byte(pCell)==iFrom ){
          put4byte(pCell, iTo);
          break;
        }
      }
    }

    if( i==nCell ){
      if( eType!=PTRMAP_BTREE ||
          get4byte(&pPage->aData[pPage->hdrOffset+8])!=iFrom ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      put4byte(&pPage->aData[pPage->hdrOffset+8], iTo);
    }
  }
  return SQLITE_OK;
}